

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QAV.h
# Opt level: O2

void __thiscall QAV<MonahanPOMDPPlanner>::GetQ(QAV<MonahanPOMDPPlanner> *this)

{
  Index in_EDX;
  Index in_ESI;
  
  GetQ((QAV<MonahanPOMDPPlanner> *)
       (&(this->super_QFunctionJointBelief).super_QFunctionJointBeliefInterface.field_0x0 +
       *(long *)((long)(this->super_QFunctionJointBelief).super_QFunctionJointBeliefInterface +
                -0x88)),in_ESI,in_EDX);
  return;
}

Assistant:

double GetQ(Index jaohI, Index jaI) const
        {
            Index t = GetPU()->GetTimeStepForJAOHI(jaohI);
            //Index t = GetPU()->GetJointActionObservationHistoryTree(jaohI)->
            //GetJointActionObservationHistory()->GetLength();
            JointBeliefInterface * jb = GetPU()->GetJointBeliefInterface(jaohI);
            double q = _m_p->GetQ (*jb, t, jaI);
            delete jb;
            return( q );
        }